

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O3

void update_pc_last_fight(CHAR_DATA *ch,CHAR_DATA *ch2)

{
  time_t tVar1;
  bool bVar2;
  
  bVar2 = is_npc(ch);
  if (!bVar2) {
    bVar2 = is_npc(ch2);
    tVar1 = current_time;
    if (ch != ch2 && !bVar2) {
      ch->last_fight_time = current_time;
      ch->last_fight_name = ch2->true_name;
      ch2->last_fight_time = tVar1;
      ch2->last_fight_name = ch->true_name;
    }
  }
  return;
}

Assistant:

void update_pc_last_fight(CHAR_DATA *ch, CHAR_DATA *ch2)
{
	if (is_npc(ch) || is_npc(ch2) || ch == ch2)
		return;

	ch->last_fight_time = current_time;
	ch->last_fight_name = ch2->true_name;

	ch2->last_fight_time = current_time;
	ch2->last_fight_name = ch->true_name;
}